

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaExporter::WriteFloatArray
          (ColladaExporter *this,string *pIdString,FloatDataType pType,ai_real *pData,
          size_t pElementCount)

{
  ostream *poVar1;
  ulong local_e0;
  size_t a_2;
  size_t a_1;
  size_t a;
  string local_a8;
  string local_78;
  undefined1 local_58 [8];
  string arrayId;
  size_t floatsPerElement;
  size_t pElementCount_local;
  ai_real *pData_local;
  FloatDataType pType_local;
  string *pIdString_local;
  ColladaExporter *this_local;
  
  switch(pType) {
  case FloatType_Vector:
    arrayId.field_2._8_8_ = 3;
    break;
  case FloatType_TexCoord2:
    arrayId.field_2._8_8_ = 2;
    break;
  case FloatType_TexCoord3:
    arrayId.field_2._8_8_ = 3;
    break;
  case FloatType_Color:
    arrayId.field_2._8_8_ = 3;
    break;
  case FloatType_Mat4x4:
    arrayId.field_2._8_8_ = 0x10;
    break;
  case FloatType_Weight:
    arrayId.field_2._8_8_ = 1;
    break;
  case FloatType_Time:
    arrayId.field_2._8_8_ = 1;
    break;
  default:
    goto switchD_0045f716_default;
  }
  XMLIDEncode(&local_78,pIdString);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,"-array");
  std::__cxx11::string::~string((string *)&local_78);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<source id=\"");
  XMLIDEncode(&local_a8,pIdString);
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  poVar1 = std::operator<<(poVar1,"\" name=\"");
  XMLEscape((string *)&a,pIdString);
  poVar1 = std::operator<<(poVar1,(string *)&a);
  poVar1 = std::operator<<(poVar1,"\">");
  std::operator<<(poVar1,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&local_a8);
  PushTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<float_array id=\"");
  poVar1 = std::operator<<(poVar1,(string *)local_58);
  poVar1 = std::operator<<(poVar1,"\" count=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pElementCount * arrayId.field_2._8_8_);
  std::operator<<(poVar1,"\"> ");
  PushTag(this);
  if (pType == FloatType_TexCoord2) {
    for (a_1 = 0; a_1 < pElementCount; a_1 = a_1 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[a_1 * 3]);
      std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[a_1 * 3 + 1]);
      std::operator<<(poVar1," ");
    }
  }
  else if (pType == FloatType_Color) {
    for (a_2 = 0; a_2 < pElementCount; a_2 = a_2 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[a_2 * 4]);
      std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[a_2 * 4 + 1]);
      std::operator<<(poVar1," ");
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[a_2 * 4 + 2]);
      std::operator<<(poVar1," ");
    }
  }
  else {
    for (local_e0 = 0; local_e0 < pElementCount * arrayId.field_2._8_8_; local_e0 = local_e0 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<(&this->field_0x38,pData[local_e0]);
      std::operator<<(poVar1," ");
    }
  }
  poVar1 = std::operator<<((ostream *)&this->field_0x38,"</float_array>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<technique_common>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<accessor count=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pElementCount);
  poVar1 = std::operator<<(poVar1,"\" offset=\"0\" source=\"#");
  poVar1 = std::operator<<(poVar1,(string *)local_58);
  poVar1 = std::operator<<(poVar1,"\" stride=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,arrayId.field_2._8_8_);
  poVar1 = std::operator<<(poVar1,"\">");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  switch(pType) {
  case FloatType_Vector:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"X\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"Y\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"Z\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_TexCoord2:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"S\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"T\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_TexCoord3:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"S\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"T\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"P\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_Color:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"R\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"G\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"B\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_Mat4x4:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"TRANSFORM\" type=\"float4x4\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_Weight:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"WEIGHT\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
    break;
  case FloatType_Time:
    poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar1 = std::operator<<(poVar1,"<param name=\"TIME\" type=\"float\" />");
    std::operator<<(poVar1,(string *)&this->endstr);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</accessor>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</technique_common>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</source>");
  std::operator<<(poVar1,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)local_58);
switchD_0045f716_default:
  return;
}

Assistant:

void ColladaExporter::WriteFloatArray( const std::string& pIdString, FloatDataType pType, const ai_real* pData, size_t pElementCount)
{
    size_t floatsPerElement = 0;
    switch( pType )
    {
        case FloatType_Vector: floatsPerElement = 3; break;
        case FloatType_TexCoord2: floatsPerElement = 2; break;
        case FloatType_TexCoord3: floatsPerElement = 3; break;
        case FloatType_Color: floatsPerElement = 3; break;
        case FloatType_Mat4x4: floatsPerElement = 16; break;
        case FloatType_Weight: floatsPerElement = 1; break;
		case FloatType_Time: floatsPerElement = 1; break;
        default:
            return;
    }

    std::string arrayId = XMLIDEncode(pIdString) + "-array";

    mOutput << startstr << "<source id=\"" << XMLIDEncode(pIdString) << "\" name=\"" << XMLEscape(pIdString) << "\">" << endstr;
    PushTag();

    // source array
    mOutput << startstr << "<float_array id=\"" << arrayId << "\" count=\"" << pElementCount * floatsPerElement << "\"> ";
    PushTag();

    if( pType == FloatType_TexCoord2 )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*3+0] << " ";
            mOutput << pData[a*3+1] << " ";
        }
    }
    else if( pType == FloatType_Color )
    {
        for( size_t a = 0; a < pElementCount; ++a )
        {
            mOutput << pData[a*4+0] << " ";
            mOutput << pData[a*4+1] << " ";
            mOutput << pData[a*4+2] << " ";
        }
    }
    else
    {
        for( size_t a = 0; a < pElementCount * floatsPerElement; ++a )
            mOutput << pData[a] << " ";
    }
    mOutput << "</float_array>" << endstr;
    PopTag();

    // the usual Collada fun. Let's bloat it even more!
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    mOutput << startstr << "<accessor count=\"" << pElementCount << "\" offset=\"0\" source=\"#" << arrayId << "\" stride=\"" << floatsPerElement << "\">" << endstr;
    PushTag();

    switch( pType )
    {
        case FloatType_Vector:
            mOutput << startstr << "<param name=\"X\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Y\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"Z\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord2:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            break;

        case FloatType_TexCoord3:
            mOutput << startstr << "<param name=\"S\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"T\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"P\" type=\"float\" />" << endstr;
            break;

        case FloatType_Color:
            mOutput << startstr << "<param name=\"R\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"G\" type=\"float\" />" << endstr;
            mOutput << startstr << "<param name=\"B\" type=\"float\" />" << endstr;
            break;

        case FloatType_Mat4x4:
            mOutput << startstr << "<param name=\"TRANSFORM\" type=\"float4x4\" />" << endstr;
            break;

        case FloatType_Weight:
            mOutput << startstr << "<param name=\"WEIGHT\" type=\"float\" />" << endstr;
            break;

		// customized, add animation related
		case FloatType_Time:
			mOutput << startstr << "<param name=\"TIME\" type=\"float\" />" << endstr;
			break;

	}

    PopTag();
    mOutput << startstr << "</accessor>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</source>" << endstr;
}